

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int kex_agree_comp(LIBSSH2_SESSION *session,libssh2_endpoint_data *endpoint,uchar *comp,
                  unsigned_long comp_len)

{
  char *pcVar1;
  uchar *puVar2;
  LIBSSH2_COMP_METHOD *pLVar3;
  size_t needle_len;
  bool bVar4;
  uchar *local_70;
  size_t local_68;
  LIBSSH2_COMP_METHOD *method;
  size_t method_len;
  uchar *p;
  uchar *s;
  LIBSSH2_COMP_METHOD **compp;
  unsigned_long comp_len_local;
  uchar *comp_local;
  libssh2_endpoint_data *endpoint_local;
  LIBSSH2_SESSION *session_local;
  
  s = (uchar *)_libssh2_comp_methods(session);
  if (endpoint->comp_prefs == (char *)0x0) {
    while( true ) {
      bVar4 = false;
      if (*(long *)s != 0) {
        bVar4 = **(long **)s != 0;
      }
      if (!bVar4) {
        return -1;
      }
      puVar2 = (uchar *)**(undefined8 **)s;
      needle_len = strlen((char *)**(undefined8 **)s);
      puVar2 = kex_agree_instr(comp,comp_len,puVar2,needle_len);
      if (puVar2 != (uchar *)0x0) break;
      s = s + 8;
    }
    endpoint->comp = *(LIBSSH2_COMP_METHOD **)s;
    session_local._4_4_ = 0;
  }
  else {
    p = (uchar *)endpoint->comp_prefs;
    while( true ) {
      bVar4 = false;
      if (p != (uchar *)0x0) {
        bVar4 = *p != '\0';
      }
      if (!bVar4) {
        return -1;
      }
      pcVar1 = strchr((char *)p,0x2c);
      if (pcVar1 == (char *)0x0) {
        local_68 = strlen((char *)p);
      }
      else {
        local_68 = (long)pcVar1 - (long)p;
      }
      puVar2 = kex_agree_instr(comp,comp_len,p,local_68);
      if (puVar2 != (uchar *)0x0) break;
      if (pcVar1 == (char *)0x0) {
        local_70 = (uchar *)0x0;
      }
      else {
        local_70 = (uchar *)(pcVar1 + 1);
      }
      p = local_70;
    }
    pLVar3 = (LIBSSH2_COMP_METHOD *)
             kex_get_method_by_name((char *)p,local_68,(LIBSSH2_COMMON_METHOD **)s);
    if (pLVar3 == (LIBSSH2_COMP_METHOD *)0x0) {
      session_local._4_4_ = -1;
    }
    else {
      endpoint->comp = pLVar3;
      session_local._4_4_ = 0;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int kex_agree_comp(LIBSSH2_SESSION *session,
                          libssh2_endpoint_data *endpoint, unsigned char *comp,
                          unsigned long comp_len)
{
    const LIBSSH2_COMP_METHOD **compp = _libssh2_comp_methods(session);
    unsigned char *s;
    (void) session;

    if (endpoint->comp_prefs) {
        s = (unsigned char *) endpoint->comp_prefs;

        while (s && *s) {
            unsigned char *p = (unsigned char *) strchr((char *) s, ',');
            size_t method_len = (p ? (size_t)(p - s) : strlen((char *) s));

            if (kex_agree_instr(comp, comp_len, s, method_len)) {
                const LIBSSH2_COMP_METHOD *method =
                    (const LIBSSH2_COMP_METHOD *)
                    kex_get_method_by_name((char *) s, method_len,
                                           (const LIBSSH2_COMMON_METHOD **)
                                           compp);

                if (!method) {
                    /* Invalid method -- Should never be reached */
                    return -1;
                }

                endpoint->comp = method;
                return 0;
            }

            s = p ? p + 1 : NULL;
        }
        return -1;
    }

    while (*compp && (*compp)->name) {
        s = kex_agree_instr(comp, comp_len, (unsigned char *) (*compp)->name,
                            strlen((*compp)->name));
        if (s) {
            endpoint->comp = *compp;
            return 0;
        }
        compp++;
    }

    return -1;
}